

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostref.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  FILE *__stream;
  size_t sVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  wasm_global_t *pwVar7;
  wasm_func_t *func;
  wasm_func_t *func_00;
  wasm_ref_t *pwVar8;
  wasm_ref_t *expected;
  wasm_ref_t *pwVar9;
  char *__s;
  wasm_val_t val;
  wasm_byte_vec_t binary;
  wasm_extern_vec_t exports;
  wasm_extern_vec_t imports;
  wasm_extern_t *externs [1];
  undefined8 local_78;
  undefined8 local_70;
  undefined1 local_68 [8];
  void *local_60;
  wasm_extern_vec_t local_58;
  undefined8 local_48;
  undefined8 *local_40;
  undefined8 local_38;
  
  puts("Initializing...");
  uVar1 = wasm_engine_new();
  uVar1 = wasm_store_new(uVar1);
  puts("Loading binary...");
  __stream = fopen("hostref.wasm","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar2 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(local_68,sVar2);
    sVar2 = fread(local_60,sVar2,1,__stream);
    if (sVar2 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar3 = wasm_module_new(uVar1,local_68);
      if (lVar3 == 0) {
        __s = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(local_68);
        puts("Creating callback...");
        uVar4 = wasm_valtype_new(0x80);
        local_38 = wasm_valtype_new(0x80);
        local_78 = uVar4;
        wasm_valtype_vec_new(&local_48,1);
        wasm_valtype_vec_new(&local_58,1,&local_38);
        uVar4 = wasm_functype_new(&local_48,&local_58);
        uVar5 = wasm_func_new(uVar1,uVar4,callback);
        wasm_functype_delete(uVar4);
        puts("Instantiating module...");
        local_38 = wasm_func_as_extern(uVar5);
        local_48 = 1;
        local_40 = &local_38;
        lVar6 = wasm_instance_new(uVar1,lVar3,&local_48,0);
        if (lVar6 != 0) {
          wasm_func_delete(uVar5);
          wasm_module_delete(lVar3);
          puts("Extracting exports...");
          wasm_instance_exports(lVar6);
          pwVar7 = get_export_global(&local_58,0);
          get_export_table(&local_58,1);
          func = get_export_func(&local_58,2);
          func_00 = get_export_func(&local_58,3);
          get_export_func(&local_58,4);
          get_export_func(&local_58,5);
          get_export_func(&local_58,6);
          wasm_instance_delete(lVar6);
          puts("Creating host references...");
          uVar4 = wasm_foreign_new(uVar1);
          pwVar8 = (wasm_ref_t *)wasm_foreign_as_ref(uVar4);
          uVar1 = wasm_foreign_new(uVar1);
          expected = (wasm_ref_t *)wasm_foreign_as_ref(uVar1);
          wasm_ref_set_host_info(pwVar8,1);
          wasm_ref_set_host_info(expected,2);
          pwVar9 = (wasm_ref_t *)wasm_ref_copy(pwVar8);
          check(pwVar9,pwVar8);
          pwVar9 = (wasm_ref_t *)wasm_ref_copy(expected);
          check(pwVar9,expected);
          local_78 = CONCAT71(local_78._1_7_,0x80);
          local_70 = wasm_ref_copy(pwVar8);
          pwVar9 = (wasm_ref_t *)wasm_ref_copy(local_70);
          check(pwVar9,pwVar8);
          pwVar9 = (wasm_ref_t *)wasm_ref_copy(local_70);
          check(pwVar9,pwVar8);
          wasm_val_delete(&local_78);
          puts("Accessing global...");
          pwVar9 = call_v_r(func_00);
          check(pwVar9,(wasm_ref_t *)0x0);
          call_r_v(func,pwVar8);
          pwVar9 = call_v_r(func_00);
          check(pwVar9,pwVar8);
          call_r_v(func,expected);
          pwVar8 = call_v_r(func_00);
          check(pwVar8,expected);
          call_r_v(func,(wasm_ref_t *)0x0);
          pwVar8 = call_v_r(func_00);
          check(pwVar8,(wasm_ref_t *)0x0);
          wasm_global_get(pwVar7);
          __assert_fail("val.kind == WASM_ANYREF",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/hostref.c"
                        ,0xe4,"int main(int, const char **)");
        }
        __s = "> Error instantiating module!";
      }
      goto LAB_00102e55;
    }
  }
  __s = "> Error loading module!";
LAB_00102e55:
  puts(__s);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("hostref.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external callback function.
  printf("Creating callback...\n");
  own wasm_functype_t* callback_type = wasm_functype_new_1_1(
    wasm_valtype_new(WASM_ANYREF), wasm_valtype_new(WASM_ANYREF));
  own wasm_func_t* callback_func =
    wasm_func_new(store, callback_type, callback);

  wasm_functype_delete(callback_type);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_t* externs[] = { wasm_func_as_extern(callback_func) };
  wasm_extern_vec_t imports = WASM_ARRAY_VEC(externs);
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(callback_func);
  wasm_module_delete(module);

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  size_t i = 0;
  wasm_global_t* global = get_export_global(&exports, i++);
  wasm_table_t* table = get_export_table(&exports, i++);
  wasm_func_t* global_set = get_export_func(&exports, i++);
  wasm_func_t* global_get = get_export_func(&exports, i++);
  wasm_func_t* table_set = get_export_func(&exports, i++);
  wasm_func_t* table_get = get_export_func(&exports, i++);
  wasm_func_t* func_call = get_export_func(&exports, i++);

  wasm_instance_delete(instance);

  // Create host references.
  printf("Creating host references...\n");
  own wasm_ref_t* host1 = wasm_foreign_as_ref(wasm_foreign_new(store));
  own wasm_ref_t* host2 = wasm_foreign_as_ref(wasm_foreign_new(store));
  wasm_ref_set_host_info(host1, (void*)1);
  wasm_ref_set_host_info(host2, (void*)2);

  // Some sanity checks.
  check(NULL, NULL);
  check(wasm_ref_copy(host1), host1);
  check(wasm_ref_copy(host2), host2);

  own wasm_val_t val;
  val.kind = WASM_ANYREF;
  val.of.ref = wasm_ref_copy(host1);
  check(wasm_ref_copy(val.of.ref), host1);
  own wasm_ref_t* ref = val.of.ref;
  check(wasm_ref_copy(ref), host1);
  wasm_val_delete(&val);

  // Interact.
  printf("Accessing global...\n");
  check(call_v_r(global_get), NULL);
  call_r_v(global_set, host1);
  check(call_v_r(global_get), host1);
  call_r_v(global_set, host2);
  check(call_v_r(global_get), host2);
  call_r_v(global_set, NULL);
  check(call_v_r(global_get), NULL);

  wasm_global_get(global, &val);
  assert(val.kind == WASM_ANYREF);
  check(val.of.ref, NULL);
  val.of.ref = host2;
  wasm_global_set(global, &val);
  check(call_v_r(global_get), host2);
  wasm_global_get(global, &val);
  assert(val.kind == WASM_ANYREF);
  check(val.of.ref, host2);

  printf("Accessing table...\n");
  check(call_i_r(table_get, 0), NULL);
  check(call_i_r(table_get, 1), NULL);
  call_ir_v(table_set, 0, host1);
  call_ir_v(table_set, 1, host2);
  check(call_i_r(table_get, 0), host1);
  check(call_i_r(table_get, 1), host2);
  call_ir_v(table_set, 0, NULL);
  check(call_i_r(table_get, 0), NULL);

  check(wasm_table_get(table, 2), NULL);
  wasm_table_set(table, 2, host1);
  check(call_i_r(table_get, 2), host1);
  check(wasm_table_get(table, 2), host1);

  printf("Accessing function...\n");
  check(call_r_r(func_call, NULL), NULL);
  check(call_r_r(func_call, host1), host1);
  check(call_r_r(func_call, host2), host2);

  wasm_ref_delete(host1);
  wasm_ref_delete(host2);

  wasm_extern_vec_delete(&exports);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}